

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryOperator.cpp
# Opt level: O2

void __thiscall
BinaryOperator::BinaryOperator
          (BinaryOperator *this,ptr<Operation> *operation,ptr<Expression> *left,
          ptr<Expression> *right)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_evaluate_00135b68;
  (this->leftExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->leftExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->leftExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->rightExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rightExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (this->rightExpression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->operation).super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->operation).super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->operation).super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

BinaryOperator::BinaryOperator(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right)
    : operation(std::move(operation)), leftExpression(std::move(left)), rightExpression(std::move(right)) { }